

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  Rep *pRVar4;
  string *psVar5;
  FileOptions *pFVar6;
  SourceCodeInfo *pSVar7;
  UnknownFieldSet *other_00;
  
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_002eb5a7;
LAB_002eb59a:
    other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_002eb59a;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002eb5a7:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
  (this->dependency_).super_RepeatedPtrFieldBase.rep_ =
       (other->dependency_).super_RepeatedPtrFieldBase.rep_;
  (other->dependency_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ =
       (other->dependency_).super_RepeatedPtrFieldBase.current_size_;
  (other->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.total_size_;
  (this->dependency_).super_RepeatedPtrFieldBase.total_size_ =
       (other->dependency_).super_RepeatedPtrFieldBase.total_size_;
  (other->dependency_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
  (this->message_type_).super_RepeatedPtrFieldBase.rep_ =
       (other->message_type_).super_RepeatedPtrFieldBase.rep_;
  (other->message_type_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ =
       (other->message_type_).super_RepeatedPtrFieldBase.current_size_;
  (other->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.total_size_;
  (this->message_type_).super_RepeatedPtrFieldBase.total_size_ =
       (other->message_type_).super_RepeatedPtrFieldBase.total_size_;
  (other->message_type_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ =
       (other->enum_type_).super_RepeatedPtrFieldBase.rep_;
  (other->enum_type_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ =
       (other->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  (other->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ =
       (other->enum_type_).super_RepeatedPtrFieldBase.total_size_;
  (other->enum_type_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->service_).super_RepeatedPtrFieldBase.rep_;
  (this->service_).super_RepeatedPtrFieldBase.rep_ =
       (other->service_).super_RepeatedPtrFieldBase.rep_;
  (other->service_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  (this->service_).super_RepeatedPtrFieldBase.current_size_ =
       (other->service_).super_RepeatedPtrFieldBase.current_size_;
  (other->service_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.total_size_;
  (this->service_).super_RepeatedPtrFieldBase.total_size_ =
       (other->service_).super_RepeatedPtrFieldBase.total_size_;
  (other->service_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ =
       (other->extension_).super_RepeatedPtrFieldBase.rep_;
  (other->extension_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ =
       (other->extension_).super_RepeatedPtrFieldBase.current_size_;
  (other->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ =
       (other->extension_).super_RepeatedPtrFieldBase.total_size_;
  (other->extension_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pvVar3 = (this->public_dependency_).arena_or_elements_;
  (this->public_dependency_).arena_or_elements_ = (other->public_dependency_).arena_or_elements_;
  (other->public_dependency_).arena_or_elements_ = pvVar3;
  iVar2 = (this->public_dependency_).current_size_;
  (this->public_dependency_).current_size_ = (other->public_dependency_).current_size_;
  (other->public_dependency_).current_size_ = iVar2;
  iVar2 = (this->public_dependency_).total_size_;
  (this->public_dependency_).total_size_ = (other->public_dependency_).total_size_;
  (other->public_dependency_).total_size_ = iVar2;
  pvVar3 = (this->weak_dependency_).arena_or_elements_;
  (this->weak_dependency_).arena_or_elements_ = (other->weak_dependency_).arena_or_elements_;
  (other->weak_dependency_).arena_or_elements_ = pvVar3;
  iVar2 = (this->weak_dependency_).current_size_;
  (this->weak_dependency_).current_size_ = (other->weak_dependency_).current_size_;
  (other->weak_dependency_).current_size_ = iVar2;
  iVar2 = (this->weak_dependency_).total_size_;
  (this->weak_dependency_).total_size_ = (other->weak_dependency_).total_size_;
  (other->weak_dependency_).total_size_ = iVar2;
  psVar5 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar5;
  psVar5 = (this->package_).ptr_;
  (this->package_).ptr_ = (other->package_).ptr_;
  (other->package_).ptr_ = psVar5;
  psVar5 = (this->syntax_).ptr_;
  (this->syntax_).ptr_ = (other->syntax_).ptr_;
  (other->syntax_).ptr_ = psVar5;
  pFVar6 = this->options_;
  this->options_ = other->options_;
  other->options_ = pFVar6;
  pSVar7 = this->source_code_info_;
  this->source_code_info_ = other->source_code_info_;
  other->source_code_info_ = pSVar7;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  package_.Swap(&other->package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  syntax_.Swap(&other->syntax_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(source_code_info_, other->source_code_info_);
}